

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundingBoxHelpers.cpp
# Opt level: O0

void __thiscall
iDynTree::BoundingBoxProjectionConstraint::setProjectionAlongDirection
          (BoundingBoxProjectionConstraint *this,Vector3 direction)

{
  DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_> *other;
  VectorFixSize<3U> *this_00;
  size_t in_RDI;
  double dVar1;
  Vector3 yProjection;
  Vector3 xProjection;
  Block<Eigen::Map<Eigen::Matrix<double,_2,_3,_1,_2,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_false>
  *this_01;
  VectorFixSize<3U> *in_stack_ffffffffffffff08;
  DenseBase<Eigen::Map<Eigen::Matrix<double,_2,_3,_1,_2,_3>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff18;
  VectorFixSize<3U> local_38;
  VectorFixSize<3U> local_20;
  
  this_01 = (Block<Eigen::Map<Eigen::Matrix<double,_2,_3,_1,_2,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_false>
             *)&stack0x00000008;
  VectorFixSize<3U>::VectorFixSize(&local_20);
  VectorFixSize<3U>::VectorFixSize(&local_38);
  VectorFixSize<3U>::setVal
            ((VectorFixSize<3U> *)in_stack_ffffffffffffff18,in_RDI,(double)in_stack_ffffffffffffff08
            );
  VectorFixSize<3U>::setVal
            ((VectorFixSize<3U> *)in_stack_ffffffffffffff18,in_RDI,(double)in_stack_ffffffffffffff08
            );
  dVar1 = VectorFixSize<3U>::getVal(in_stack_ffffffffffffff08,(size_t)this_01);
  other = (DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_> *)
          ((ulong)dVar1 ^ 0x8000000000000000);
  VectorFixSize<3U>::getVal(in_stack_ffffffffffffff08,(size_t)this_01);
  VectorFixSize<3U>::setVal
            ((VectorFixSize<3U> *)in_stack_ffffffffffffff18,in_RDI,(double)in_stack_ffffffffffffff08
            );
  VectorFixSize<3U>::setVal
            ((VectorFixSize<3U> *)in_stack_ffffffffffffff18,in_RDI,(double)in_stack_ffffffffffffff08
            );
  VectorFixSize<3U>::setVal
            ((VectorFixSize<3U> *)in_stack_ffffffffffffff18,in_RDI,(double)in_stack_ffffffffffffff08
            );
  dVar1 = VectorFixSize<3U>::getVal(in_stack_ffffffffffffff08,(size_t)this_01);
  this_00 = (VectorFixSize<3U> *)((ulong)dVar1 ^ 0x8000000000000000);
  VectorFixSize<3U>::getVal(this_00,(size_t)this_01);
  VectorFixSize<3U>::setVal((VectorFixSize<3U> *)in_stack_ffffffffffffff18,in_RDI,(double)this_00);
  toEigen<3U>((VectorFixSize<3U> *)in_stack_ffffffffffffff18);
  toEigen<2u,3u>((MatrixFixSize<2U,_3U> *)in_stack_ffffffffffffff18);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,2,3,1,2,3>,0,Eigen::Stride<0,0>>>::block<1,3>
            (in_stack_ffffffffffffff18,in_RDI,(Index)this_00);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,2,3,1,2,3>,0,Eigen::Stride<0,0>>,1,3,false>::
  operator=(this_01,other);
  toEigen<3U>((VectorFixSize<3U> *)in_stack_ffffffffffffff18);
  toEigen<2u,3u>((MatrixFixSize<2U,_3U> *)in_stack_ffffffffffffff18);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,2,3,1,2,3>,0,Eigen::Stride<0,0>>>::block<1,3>
            (in_stack_ffffffffffffff18,in_RDI,(Index)this_00);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,2,3,1,2,3>,0,Eigen::Stride<0,0>>,1,3,false>::
  operator=(this_01,other);
  return;
}

Assistant:

void BoundingBoxProjectionConstraint::setProjectionAlongDirection(Vector3 direction)
    {
        Vector3 xProjection, yProjection;

        // define the projection for the x-component
        xProjection.setVal(0, 1.0);
        xProjection.setVal(1, 0.0);
        xProjection.setVal(2, -direction.getVal(0) / direction.getVal(2));

        // define the projection for the y-component
        yProjection.setVal(0, 0.0);
        yProjection.setVal(1, 1.0);
        yProjection.setVal(2, -direction.getVal(1) / direction.getVal(2));

        // fill the projection matrix
        toEigen(Pdirection).block<1, 3>(0,0) = toEigen(xProjection);
        toEigen(Pdirection).block<1, 3>(1,0) = toEigen(yProjection);

    }